

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::MakeDirectory(char *path)

{
  bool bVar1;
  allocator local_29;
  string local_28;
  
  if (path == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_28,path,&local_29);
    bVar1 = MakeDirectory(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return bVar1;
}

Assistant:

bool SystemTools::MakeDirectory(const char* path)
{
  if(!path)
    {
    return false;
    }
  return SystemTools::MakeDirectory(kwsys_stl::string(path));
}